

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O1

string * __thiscall
glcts::generateBasicFragmentSrc_abi_cxx11_
          (string *__return_storage_ptr__,glcts *this,GLSLVersion glslVersion)

{
  char *__s;
  size_t sVar1;
  stringstream str;
  stringstream asStack_1a8 [16];
  undefined1 local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  __s = glu::getGLSLVersionDeclaration((GLSLVersion)this);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_198 + (int)*(_func_int **)(local_198._0_8_ + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "uniform highp vec4 u_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n   o_color = u_color;\n}\n"
             ,0x76);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

static std::string generateBasicFragmentSrc(glu::GLSLVersion glslVersion)
{
	std::stringstream str;

	str << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
	str << "uniform highp vec4 u_color;\n"
		   "layout(location = 0) out mediump vec4 o_color;\n"
		   "void main (void)\n"
		   "{\n"
		   "   o_color = u_color;\n"
		   "}\n";

	return str.str();
}